

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall
helics::Publication::publish
          (Publication *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *val)

{
  ValueFederate *pVVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> val_00;
  basic_string_view<char,_std::char_traits<char>_> str;
  SmallBuffer buffer;
  allocator<char> local_d9;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  undefined1 local_c8 [32];
  data_view local_a8;
  SmallBuffer local_88;
  
  ValueConverter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::convert(&local_88,val);
  local_c8._0_8_ = local_88.bufferSize;
  local_c8._8_8_ = local_88.heap;
  local_c8._16_8_ = (element_type *)0x0;
  local_c8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  val_00 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                     ((data_view *)local_c8);
  local_d8 = val_00;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x18));
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->prevValue,val_00,this->delta);
    if (!bVar2) goto LAB_001c82f9;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_c8,&local_d8,&local_d9);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    local_a8.dblock._M_len = local_88.bufferSize;
    local_a8.dblock._M_str = (char *)local_88.heap;
    local_a8.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_a8);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a8.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_001c82f9:
  SmallBuffer::~SmallBuffer(&local_88);
  return;
}

Assistant:

void Publication::publish(const std::vector<std::string>& val)
{
    auto buffer = ValueConverter<std::vector<std::string>>::convert(val);
    auto str = ValueConverter<std::string_view>::interpret(buffer);
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, str, delta)) {
            prevValue = std::string(str);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        fed->publishBytes(*this, buffer);
    }
}